

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SWDAnalyzer.cpp
# Opt level: O2

void __thiscall SWDAnalyzer::SWDAnalyzer(SWDAnalyzer *this)

{
  Analyzer2::Analyzer2(&this->super_Analyzer2);
  *(undefined ***)this = &PTR__SWDAnalyzer_0010fca0;
  SWDAnalyzerSettings::SWDAnalyzerSettings(&this->mSettings);
  (this->mResults)._M_ptr = (SWDAnalyzerResults *)0x0;
  SWDSimulationDataGenerator::SWDSimulationDataGenerator(&this->mSimulationDataGenerator);
  SWDParser::SWDParser(&this->mSWDParser);
  this->mSimulationInitilized = false;
  Analyzer::SetAnalyzerSettings((AnalyzerSettings *)this);
  return;
}

Assistant:

SWDAnalyzer::SWDAnalyzer() : mSimulationInitilized( false )
{
    SetAnalyzerSettings( &mSettings );
}